

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O0

void e2e_crash_recover_test(bool do_rollback)

{
  fdb_status fVar1;
  time_t tVar2;
  byte in_DIL;
  fdb_snapshot_info_t *markers;
  uint64_t num_markers;
  uint64_t k;
  fdb_seqnum_t seqno;
  fdb_config fconfig;
  fdb_kvs_config kvs_config;
  fdb_status status;
  fdb_kvs_info info;
  fdb_kvs_handle *snap_db;
  idx_prams_t index_params;
  checkpoint_t verification_checkpoint;
  storage_t *st;
  int n_checkpoints;
  int n;
  int i;
  bool walflush;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  storage_t *in_stack_000007f0;
  uint64_t *in_stack_00000b38;
  fdb_snapshot_info_t **in_stack_00000b40;
  fdb_file_handle *in_stack_00000b48;
  undefined7 in_stack_fffffffffffff9d8;
  undefined1 in_stack_fffffffffffff9df;
  checkpoint_t *in_stack_fffffffffffff9e0;
  idx_prams_t *in_stack_fffffffffffff9e8;
  checkpoint_t *markers_00;
  fdb_kvs_config *in_stack_fffffffffffff9f0;
  fdb_config *in_stack_fffffffffffff9f8;
  fdb_config *in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa10;
  undefined4 uVar3;
  undefined1 in_stack_fffffffffffffa2f;
  fdb_file_handle *in_stack_fffffffffffffa30;
  fdb_seqnum_t in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb08;
  fdb_kvs_info *in_stack_fffffffffffffb40;
  fdb_kvs_handle *in_stack_fffffffffffffb48;
  undefined1 local_4a0 [15];
  undefined1 in_stack_fffffffffffffb6f;
  storage_t *in_stack_fffffffffffffb70;
  storage_t *in_stack_fffffffffffffb90;
  fdb_seqnum_t in_stack_fffffffffffffc80;
  fdb_kvs_handle **in_stack_fffffffffffffc88;
  fdb_kvs_handle *in_stack_fffffffffffffc90;
  int local_64;
  int local_60;
  timeval local_18;
  byte local_1;
  
  local_1 = in_DIL & 1;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  memleak_start();
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  rm_storage_fs();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  uVar3 = 0x1e;
  gen_index_params((idx_prams_t *)in_stack_fffffffffffffa30);
  memset(local_4a0,0,0x430);
  init_storage(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
               in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,(bool)in_stack_fffffffffffff9df);
  for (local_60 = 0; local_60 < 100; local_60 = local_60 + 1) {
    load_persons(in_stack_000007f0);
    e2e_fdb_commit(in_stack_fffffffffffffa30,(bool)in_stack_fffffffffffffa2f);
  }
  if ((local_1 & 1) == 0) {
    fVar1 = fdb_get_all_snap_markers(in_stack_00000b48,in_stack_00000b40,in_stack_00000b38);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
              ,0x4fc);
      e2e_crash_recover_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                      ,0x4fc,"void e2e_crash_recover_test(bool)");
      }
    }
    for (markers_00 = (checkpoint_t *)0x0; markers_00 < in_stack_fffffffffffff9e0;
        markers_00 = (checkpoint_t *)(markers_00->key + 10)) {
      load_persons(in_stack_000007f0);
    }
    fdb_free_snap_markers((fdb_snapshot_info_t *)markers_00,(uint64_t)in_stack_fffffffffffff9e0);
  }
  else {
    fVar1 = fdb_get_all_snap_markers(in_stack_00000b48,in_stack_00000b40,in_stack_00000b38);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
              ,0x4f0);
      e2e_crash_recover_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                      ,0x4f0,"void e2e_crash_recover_test(bool)");
      }
      fVar1 = FDB_RESULT_SUCCESS;
    }
    for (markers_00 = (checkpoint_t *)0x0; markers_00 < in_stack_fffffffffffff9e0;
        markers_00 = (checkpoint_t *)(markers_00->key + 10)) {
      in_stack_fffffffffffff9f0 =
           *(fdb_kvs_config **)
            (*(long *)(CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8) +
                       (long)markers_00 * 0x18 + 0x10) + 8);
      fVar1 = fdb_rollback((fdb_kvs_handle **)CONCAT44(fVar1,in_stack_fffffffffffffb08),
                           in_stack_fffffffffffffb00);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                ,0x4f6);
        e2e_crash_recover_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                        ,0x4f6,"void e2e_crash_recover_test(bool)");
        }
        fVar1 = FDB_RESULT_SUCCESS;
      }
    }
    fdb_free_snap_markers((fdb_snapshot_info_t *)markers_00,(uint64_t)in_stack_fffffffffffff9e0);
  }
  e2e_fdb_close((storage_t *)0x107b87);
  corrupt_latest_superblock((char *)CONCAT44(uVar3,in_stack_fffffffffffffa10));
  gen_index_params((idx_prams_t *)in_stack_fffffffffffffa30);
  memset(local_4a0,0,0x430);
  init_storage(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
               (idx_prams_t *)markers_00,in_stack_fffffffffffff9e0,(bool)in_stack_fffffffffffff9df);
  local_64 = 0;
  do {
    if (1 < local_64) {
      e2e_fdb_shutdown((storage_t *)0x107dce);
      memleak_end();
      if ((local_1 & 1) == 0) {
        if (e2e_crash_recover_test::__test_pass == 0) {
          fprintf(_stderr,"%s FAILED\n","TEST: e2e crash recover test");
        }
        else {
          fprintf(_stderr,"%s PASSED\n","TEST: e2e crash recover test");
        }
      }
      else if (e2e_crash_recover_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","TEST: e2e crash recover test with rollback");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","TEST: e2e crash recover test with rollback");
      }
      return;
    }
    load_persons(in_stack_000007f0);
    for (local_60 = 0; local_60 < 100; local_60 = local_60 + 1) {
      load_persons(in_stack_000007f0);
      e2e_fdb_commit(in_stack_fffffffffffffa30,(bool)in_stack_fffffffffffffa2f);
      fVar1 = fdb_get_kvs_info(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                ,0x516);
        e2e_crash_recover_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                        ,0x516,"void e2e_crash_recover_test(bool)");
        }
        fVar1 = FDB_RESULT_SUCCESS;
      }
      fdb_snapshot_open(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                        in_stack_fffffffffffffc80);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                ,0x518);
        e2e_crash_recover_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                        ,0x518,"void e2e_crash_recover_test(bool)");
        }
      }
      update_index(in_stack_fffffffffffffb70,(bool)in_stack_fffffffffffffb6f);
      verify_db(in_stack_fffffffffffffb90);
      fdb_kvs_close((fdb_kvs_handle *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8))
      ;
    }
    local_64 = local_64 + 1;
  } while( true );
}

Assistant:

void e2e_crash_recover_test(bool do_rollback) {

    TEST_INIT();
    memleak_start();

    randomize();

    bool walflush = true;
    int i, n;
    int n_checkpoints =  2;

    rm_storage_fs();
    storage_t *st;
    checkpoint_t verification_checkpoint;
    idx_prams_t index_params;
    fdb_kvs_handle *snap_db;
    fdb_kvs_info info;
    fdb_status status;

    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.durability_opt = FDB_DRB_ASYNC;
    fconfig.purging_interval = 30; // retain deleted docs for iteration

    gen_index_params(&index_params);
    memset(&verification_checkpoint, 0, sizeof(checkpoint_t));
    st = init_storage(&fconfig, &fconfig, &kvs_config,
                      &index_params, &verification_checkpoint, walflush);

    for (i = 0; i < 100; ++i) {
        load_persons(st);
        e2e_fdb_commit(st->main, true);
    }

    fdb_seqnum_t seqno;
    uint64_t k, num_markers;
    fdb_snapshot_info_t *markers;

    if (do_rollback) {
        status = fdb_get_all_snap_markers(st->main, &markers,
                                          &num_markers);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        for (k = 0; k < num_markers; k += 10) {
            // rollback to each marker
            seqno = markers[k].kvs_markers[0].seqnum;
            status = fdb_rollback(&st->all_docs, seqno);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        fdb_free_snap_markers(markers, num_markers);
    } else {
        status = fdb_get_all_snap_markers(st->main, &markers,
                                          &num_markers);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        for (k = 0; k < num_markers; k += 10) {
            load_persons(st);
        }
        fdb_free_snap_markers(markers, num_markers);
    }

    // close storage
    e2e_fdb_close(st);

    corrupt_latest_superblock(E2EDB_MAIN);

    // reopen storage
    gen_index_params(&index_params);
    memset(&verification_checkpoint, 0, sizeof(checkpoint_t));
    st = init_storage(&fconfig, &fconfig, &kvs_config,
                      &index_params, &verification_checkpoint, walflush);

    // run verifiable workload
    for (n = 0; n < n_checkpoints; ++n) {
        load_persons(st);
        for (i = 0; i < 100; ++i) {
            load_persons(st);
            e2e_fdb_commit(st->main, walflush);
            status = fdb_get_kvs_info(st->all_docs, &info);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            fdb_snapshot_open(st->all_docs, &snap_db, info.last_seqnum);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            update_index(st, true);
            verify_db(st);
            fdb_kvs_close(snap_db);
        }
    }

    // teardown
    e2e_fdb_shutdown(st);
    memleak_end();
    if (do_rollback) {
        TEST_RESULT("TEST: e2e crash recover test with rollback");
    } else {
        TEST_RESULT("TEST: e2e crash recover test");
    }
}